

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

QVariant * __thiscall
QWidgetTextControl::inputMethodQuery
          (QWidgetTextControl *this,InputMethodQuery property,QVariant *argument)

{
  QStringView v;
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QWidgetTextControlPrivate *pQVar8;
  qsizetype qVar9;
  bool *in_RCX;
  int in_EDX;
  QRectF *in_RSI;
  QFont *in_RDI;
  long in_FS_OFFSET;
  int currentBlock_1;
  int resultLen;
  int numBlocks;
  int localPos_1;
  int maxLength_1;
  int currentBlock;
  int localPos;
  int maxLength;
  QWidgetTextControlPrivate *d;
  QString result_1;
  QTextCursor tmpCursor_1;
  QString result;
  QTextCursor tmpCursor;
  QPointF pt_1;
  QPointF pt;
  QTextBlock block;
  QString *in_stack_fffffffffffffd28;
  QPointF *in_stack_fffffffffffffd30;
  QString *in_stack_fffffffffffffd38;
  QStringView *in_stack_fffffffffffffd40;
  QStringView *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  undefined4 in_stack_fffffffffffffd60;
  int iVar10;
  undefined4 in_stack_fffffffffffffd64;
  int in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdb8;
  int iVar11;
  undefined4 in_stack_fffffffffffffdbc;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8 [4];
  undefined2 local_182;
  undefined1 local_160 [24];
  QString local_148;
  undefined1 *local_130;
  QTextCursor local_128 [8];
  undefined8 local_120;
  undefined8 local_118;
  undefined1 local_110 [24];
  undefined1 local_f8 [24];
  QTextCursor local_e0 [8];
  undefined8 local_d8;
  undefined8 local_d0;
  QFont local_28 [16];
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = d_func((QWidgetTextControl *)0x71c20f);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::block();
  if (in_EDX == 2) {
    cursorRect((QWidgetTextControl *)in_stack_fffffffffffffd40);
    ::QVariant::QVariant((QVariant *)in_RDI,in_RSI);
  }
  else if (in_EDX == 4) {
    QTextCursor::charFormat();
    QTextCharFormat::font();
    QFont::operator_cast_to_QVariant(in_RDI);
    QFont::~QFont(local_28);
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x71c40d);
  }
  else if (in_EDX == 8) {
    local_d8 = 0xffffffffffffffff;
    local_d0 = 0xffffffffffffffff;
    local_d8 = ::QVariant::toPointF();
    bVar1 = QPointF::isNull(in_stack_fffffffffffffd30);
    if (bVar1) {
      iVar10 = QTextCursor::position();
      iVar2 = QTextBlock::position();
      ::QVariant::QVariant((QVariant *)in_RDI,iVar10 - iVar2);
    }
    else {
      cursorForPosition((QWidgetTextControl *)
                        CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                        (QPointF *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      iVar10 = QTextCursor::position();
      iVar2 = QTextBlock::position();
      ::QVariant::QVariant((QVariant *)in_RDI,iVar10 - iVar2);
      QTextCursor::~QTextCursor(local_e0);
    }
  }
  else if (in_EDX == 0x10) {
    QTextBlock::text();
    ::QVariant::QVariant((QVariant *)in_RDI,(QString *)local_f8);
    QString::~QString((QString *)0x71c525);
  }
  else if (in_EDX == 0x20) {
    QTextCursor::selectedText();
    ::QVariant::QVariant((QVariant *)in_RDI,(QString *)local_110);
    QString::~QString((QString *)0x71c565);
  }
  else if (in_EDX == 0x40) {
    ::QVariant::QVariant((QVariant *)0x71c574);
  }
  else if (in_EDX == 0x80) {
    iVar10 = QTextCursor::anchor();
    iVar2 = QTextBlock::position();
    ::QVariant::QVariant((QVariant *)in_RDI,iVar10 - iVar2);
  }
  else if (in_EDX == 0x400) {
    local_120 = 0xffffffffffffffff;
    local_118 = 0xffffffffffffffff;
    local_120 = ::QVariant::toPointF();
    bVar1 = QPointF::isNull(in_stack_fffffffffffffd30);
    if (bVar1) {
      iVar10 = QTextCursor::position();
      ::QVariant::QVariant((QVariant *)in_RDI,iVar10);
    }
    else {
      cursorForPosition((QWidgetTextControl *)
                        CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                        (QPointF *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      iVar10 = QTextCursor::position();
      ::QVariant::QVariant((QVariant *)in_RDI,iVar10);
      QTextCursor::~QTextCursor(local_128);
    }
  }
  else if (in_EDX == 0x800) {
    bVar1 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffd30);
    if (bVar1) {
      iVar10 = ::QVariant::toInt(in_RCX);
    }
    else {
      iVar10 = 0x400;
    }
    local_1a8[0] = &DAT_aaaaaaaaaaaaaaaa;
    iVar2 = iVar10;
    QTextCursor::QTextCursor((QTextCursor *)local_1a8,&pQVar8->cursor);
    iVar4 = QTextCursor::position();
    iVar5 = QTextBlock::position();
    iVar11 = 0;
    for (iVar5 = iVar4 - iVar5; iVar5 < iVar10; iVar5 = iVar6 + iVar5) {
      iVar6 = QTextCursor::blockNumber();
      QTextCursor::movePosition((MoveOperation)local_1a8,6,0);
      iVar7 = QTextCursor::blockNumber();
      if (iVar7 == iVar6) break;
      iVar11 = iVar11 + 1;
      QTextCursor::block();
      iVar6 = QTextBlock::length();
    }
    local_1c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_1b8 = &DAT_aaaaaaaaaaaaaaaa;
    local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x71ca1b);
    for (; iVar11 != 0; iVar11 = iVar11 + -1) {
      QTextCursor::block();
      QTextBlock::text();
      ::operator+(in_stack_fffffffffffffd38,(char16_t *)in_stack_fffffffffffffd30);
      ::operator+=((QString *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                   (QStringBuilder<QString,_char16_t> *)CONCAT44(in_stack_fffffffffffffd5c,iVar2));
      QStringBuilder<QString,_char16_t>::~QStringBuilder
                ((QStringBuilder<QString,_char16_t> *)0x71ca9c);
      QString::~QString((QString *)0x71caa9);
      QTextCursor::movePosition((MoveOperation)local_1a8,0x10,0);
    }
    QTextBlock::text();
    QStringView::QStringView<QString,_true>(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    QStringView::mid(in_stack_fffffffffffffd48,CONCAT44(in_stack_fffffffffffffd5c,iVar2),
                     CONCAT44(iVar4,in_stack_fffffffffffffd50));
    v.m_data = (storage_type_conflict *)in_stack_fffffffffffffd48;
    v.m_size = (qsizetype)in_stack_fffffffffffffd40;
    QString::operator+=(in_stack_fffffffffffffd28,v);
    QString::~QString((QString *)0x71cb4f);
    ::QVariant::QVariant((QVariant *)in_RDI,(QString *)&local_1c0);
    QString::~QString((QString *)0x71cb6e);
    QTextCursor::~QTextCursor((QTextCursor *)local_1a8);
  }
  else if (in_EDX == 0x1000) {
    bVar1 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffd30);
    if (bVar1) {
      iVar10 = ::QVariant::toInt(in_RCX);
    }
    else {
      iVar10 = 0x400;
    }
    local_130 = &DAT_aaaaaaaaaaaaaaaa;
    iVar2 = iVar10;
    QTextCursor::QTextCursor((QTextCursor *)&local_130,&pQVar8->cursor);
    uVar3 = QTextCursor::position();
    QTextBlock::position();
    local_148.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_148.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_148.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::text();
    QString::mid((longlong)&local_148,(longlong)local_160);
    QString::~QString((QString *)0x71c774);
    while (qVar9 = QString::size(&local_148), qVar9 < iVar10) {
      iVar4 = QTextCursor::blockNumber();
      QTextCursor::movePosition((MoveOperation)&local_130,0x10,0);
      iVar5 = QTextCursor::blockNumber();
      if (iVar5 == iVar4) break;
      local_182 = 10;
      QTextCursor::block();
      QTextBlock::text();
      ::operator+((char16_t *)in_stack_fffffffffffffd38,(QString *)in_stack_fffffffffffffd30);
      ::operator+=((QString *)CONCAT44(in_stack_fffffffffffffd64,iVar2),
                   (QStringBuilder<char16_t,_QString> *)CONCAT44(uVar3,in_stack_fffffffffffffd58));
      QStringBuilder<char16_t,_QString>::~QStringBuilder
                ((QStringBuilder<char16_t,_QString> *)0x71c84d);
      QString::~QString((QString *)0x71c85a);
    }
    ::QVariant::QVariant((QVariant *)in_RDI,(QString *)&local_148);
    QString::~QString((QString *)0x71c87e);
    QTextCursor::~QTextCursor((QTextCursor *)&local_130);
  }
  else if (in_EDX == 0x4000) {
    QTextCursor::anchor();
    QWidgetTextControlPrivate::rectForPosition
              ((QWidgetTextControlPrivate *)
               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
               in_stack_fffffffffffffdb4);
    ::QVariant::QVariant((QVariant *)in_RDI,(QRectF *)pQVar8);
  }
  else {
    ::QVariant::QVariant((QVariant *)0x71cb87);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QVariant *)in_RDI;
}

Assistant:

QVariant QWidgetTextControl::inputMethodQuery(Qt::InputMethodQuery property, QVariant argument) const
{
    Q_D(const QWidgetTextControl);
    QTextBlock block = d->cursor.block();
    switch(property) {
    case Qt::ImCursorRectangle:
        return cursorRect();
    case Qt::ImAnchorRectangle:
        return d->rectForPosition(d->cursor.anchor());
    case Qt::ImFont:
        return QVariant(d->cursor.charFormat().font());
    case Qt::ImCursorPosition: {
        const QPointF pt = argument.toPointF();
        if (!pt.isNull())
            return QVariant(cursorForPosition(pt).position() - block.position());
        return QVariant(d->cursor.position() - block.position()); }
    case Qt::ImSurroundingText:
        return QVariant(block.text());
    case Qt::ImCurrentSelection:
        return QVariant(d->cursor.selectedText());
    case Qt::ImMaximumTextLength:
        return QVariant(); // No limit.
    case Qt::ImAnchorPosition:
        return QVariant(d->cursor.anchor() - block.position());
    case Qt::ImAbsolutePosition: {
        const QPointF pt = argument.toPointF();
        if (!pt.isNull())
            return QVariant(cursorForPosition(pt).position());
        return QVariant(d->cursor.position()); }
    case Qt::ImTextAfterCursor:
    {
        int maxLength = argument.isValid() ? argument.toInt() : 1024;
        QTextCursor tmpCursor = d->cursor;
        int localPos = d->cursor.position() - block.position();
        QString result = block.text().mid(localPos);
        while (result.size() < maxLength) {
            int currentBlock = tmpCursor.blockNumber();
            tmpCursor.movePosition(QTextCursor::NextBlock);
            if (tmpCursor.blockNumber() == currentBlock)
                break;
            result += u'\n' + tmpCursor.block().text();
        }
        return QVariant(result);
    }
    case Qt::ImTextBeforeCursor:
    {
        int maxLength = argument.isValid() ? argument.toInt() : 1024;
        QTextCursor tmpCursor = d->cursor;
        int localPos = d->cursor.position() - block.position();
        int numBlocks = 0;
        int resultLen = localPos;
        while (resultLen < maxLength) {
            int currentBlock = tmpCursor.blockNumber();
            tmpCursor.movePosition(QTextCursor::PreviousBlock);
            if (tmpCursor.blockNumber() == currentBlock)
                break;
            numBlocks++;
            resultLen += tmpCursor.block().length();
        }
        QString result;
        while (numBlocks) {
            result += tmpCursor.block().text() + u'\n';
            tmpCursor.movePosition(QTextCursor::NextBlock);
            --numBlocks;
        }
        result += QStringView{block.text()}.mid(0, localPos);
        return QVariant(result);
    }
    default:
        return QVariant();
    }
}